

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cc
# Opt level: O3

void brotli::ConvertBitDepthsToSymbols(uint8_t *depth,size_t len,uint16_t *bits)

{
  byte bVar1;
  int bits_1;
  size_t sVar2;
  long lVar3;
  uint16_t uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  short sStack_4a;
  ulong uStack_48;
  uint16_t bl_count [16];
  
  bl_count[4] = 0;
  bl_count[5] = 0;
  bl_count[6] = 0;
  bl_count[7] = 0;
  bl_count[8] = 0;
  bl_count[9] = 0;
  bl_count[10] = 0;
  bl_count[0xb] = 0;
  uStack_48 = 0;
  bl_count[0] = 0;
  bl_count[1] = 0;
  bl_count[2] = 0;
  bl_count[3] = 0;
  if (len != 0) {
    sVar2 = 0;
    do {
      bl_count[(ulong)depth[sVar2] - 4] = bl_count[(ulong)depth[sVar2] - 4] + 1;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  uStack_48 = uStack_48 & 0xffffffffffff0000;
  lVar3 = 1;
  uVar4 = 0;
  do {
    uVar4 = (uVar4 + (&sStack_4a)[lVar3]) * 2;
    bl_count[lVar3 + 0xc] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  if (len != 0) {
    sVar2 = 0;
    do {
      bVar1 = depth[sVar2];
      if (bVar1 != 0) {
        uVar6 = (uint)bl_count[(ulong)bVar1 + 0xc];
        bl_count[(ulong)bVar1 + 0xc] = bl_count[(ulong)bVar1 + 0xc] + 1;
        uVar5 = *(ulong *)((anonymous_namespace)::ReverseBits(int,unsigned_short)::kLut +
                          (ulong)(uVar6 & 0xf) * 8);
        if (4 < bVar1) {
          uVar7 = 4;
          do {
            uVar6 = uVar6 >> 4;
            uVar5 = uVar5 << 4 |
                    *(ulong *)((anonymous_namespace)::ReverseBits(int,unsigned_short)::kLut +
                              (ulong)(uVar6 & 0xf) * 8);
            uVar7 = uVar7 + 4;
          } while (uVar7 < bVar1);
        }
        bits[sVar2] = (uint16_t)(uVar5 >> (-bVar1 & 3));
      }
      sVar2 = sVar2 + 1;
    } while (sVar2 != len);
  }
  return;
}

Assistant:

void ConvertBitDepthsToSymbols(const uint8_t *depth,
                               size_t len,
                               uint16_t *bits) {
  // In Brotli, all bit depths are [1..15]
  // 0 bit depth means that the symbol does not exist.
  const int kMaxBits = 16;  // 0..15 are values for bits
  uint16_t bl_count[kMaxBits] = { 0 };
  {
    for (size_t i = 0; i < len; ++i) {
      ++bl_count[depth[i]];
    }
    bl_count[0] = 0;
  }
  uint16_t next_code[kMaxBits];
  next_code[0] = 0;
  {
    int code = 0;
    for (int bits = 1; bits < kMaxBits; ++bits) {
      code = (code + bl_count[bits - 1]) << 1;
      next_code[bits] = static_cast<uint16_t>(code);
    }
  }
  for (size_t i = 0; i < len; ++i) {
    if (depth[i]) {
      bits[i] = ReverseBits(depth[i], next_code[depth[i]]++);
    }
  }
}